

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O3

void __thiscall
particle_decay::perform_decays
          (particle_decay *this,particle_info *mother,
          vector<particle_info,_std::allocator<particle_info>_> *daughter_list)

{
  _Rb_tree_header *p_Var1;
  pointer *ppaVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  element_type *peVar6;
  undefined4 uVar7;
  uint uVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  mapped_type *pmVar11;
  pointer paVar12;
  iterator iVar13;
  long lVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  particle_info *ppVar17;
  byte bVar18;
  double dVar19;
  double dVar20;
  particle_decay_info mother_decay_info;
  particle_info daughter1;
  particle_info daughter2;
  particle_info daughter3;
  int local_21c;
  int local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  double local_1f0;
  double dStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  int local_1c0;
  vector<decay_channel_info,_std::allocator<decay_channel_info>_> local_1b8;
  int local_1a0;
  particle_info local_198;
  particle_info local_120;
  particle_info local_a8;
  
  bVar18 = 0;
  local_208 = 0;
  local_200[0] = 0;
  local_1b8.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var9 = (this->resonance_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_210 = local_200;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->resonance_table_)._M_t._M_impl.super__Rb_tree_header;
    iVar4 = mother->monval;
    p_Var15 = &p_Var1->_M_header;
    do {
      if (iVar4 <= (int)p_Var9[1]._M_color) {
        p_Var15 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < iVar4];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var15 != p_Var1) && ((int)p_Var15[1]._M_color <= iVar4)) {
      pmVar11 = std::
                map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                ::operator[](&this->resonance_table_,&mother->monval);
      local_218 = pmVar11->monval;
      std::__cxx11::string::_M_assign((string *)&local_210);
      local_1c0 = pmVar11->stable;
      local_1f0 = pmVar11->mass;
      dStack_1e8 = pmVar11->width;
      local_1e0._0_4_ = pmVar11->gspin;
      local_1e0._4_4_ = pmVar11->baryon;
      uStack_1d8._0_4_ = pmVar11->strange;
      uStack_1d8._4_4_ = pmVar11->charm;
      local_1d0._0_4_ = pmVar11->bottom;
      local_1d0._4_4_ = pmVar11->gisospin;
      uStack_1c8._0_4_ = pmVar11->charge;
      uStack_1c8._4_4_ = pmVar11->decays;
      std::vector<decay_channel_info,_std::allocator<decay_channel_info>_>::operator=
                (&local_1b8,&pmVar11->decay_channels);
      local_1a0 = pmVar11->sign;
      if (local_1c0 == 1) {
        iVar13._M_current =
             (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     mother);
        }
        else {
          for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar7 = *(undefined4 *)&mother->field_0x4;
            (iVar13._M_current)->monval = mother->monval;
            *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar7;
            mother = (particle_info *)((long)mother + (ulong)bVar18 * -0x10 + 8);
            iVar13._M_current = iVar13._M_current + (ulong)bVar18 * -0x10 + 8;
          }
          ppaVar2 = &(daughter_list->
                     super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        goto LAB_00135002;
      }
      uVar8 = uStack_1c8._4_4_;
      uVar16 = (ulong)uStack_1c8._4_4_;
      peVar6 = (this->ran_gen_ptr_).
               super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar19 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)(peVar6->ran_generator)._M_t.
                             super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                             .
                             super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                         );
      if (0 < (int)uVar8) {
        dVar3 = (peVar6->rand_uniform_dist)._M_param._M_a;
        dVar20 = 0.0;
        paVar12 = local_1b8.
                  super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          dVar20 = dVar20 + paVar12->branching_ratio;
          if (dVar19 * ((peVar6->rand_uniform_dist)._M_param._M_b - dVar3) + dVar3 < dVar20)
          goto LAB_00135119;
          paVar12 = paVar12 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      paVar12 = (pointer)0x0;
LAB_00135119:
      if (paVar12->decay_Npart == 3) {
        local_21c = paVar12->decay_part[0];
        iVar4 = paVar12->decay_part[1];
        iVar5 = paVar12->decay_part[2];
        local_198.monval = local_21c;
        local_120.monval = iVar4;
        local_a8.monval = iVar5;
        pmVar11 = std::
                  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  ::at(&this->resonance_table_,&local_21c);
        local_198.mass = pmVar11->mass;
        local_21c = iVar4;
        pmVar11 = std::
                  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  ::at(&this->resonance_table_,&local_21c);
        local_120.mass = pmVar11->mass;
        local_21c = iVar5;
        pmVar11 = std::
                  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  ::at(&this->resonance_table_,&local_21c);
        local_a8.mass = pmVar11->mass;
        perform_three_body_decay(this,mother,&local_198,&local_120,&local_a8);
        iVar13._M_current =
             (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     &local_198);
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppVar17 = &local_198;
          for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar7 = *(undefined4 *)&ppVar17->field_0x4;
            (iVar13._M_current)->monval = ppVar17->monval;
            *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar7;
            ppVar17 = (particle_info *)((long)ppVar17 + ((ulong)bVar18 * -2 + 1) * 8);
            iVar13._M_current = iVar13._M_current + (ulong)bVar18 * -0x10 + 8;
          }
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish + 1;
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_finish = iVar13._M_current;
        }
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     &local_120);
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppVar17 = &local_120;
          for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar7 = *(undefined4 *)&ppVar17->field_0x4;
            (iVar13._M_current)->monval = ppVar17->monval;
            *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar7;
            ppVar17 = (particle_info *)((long)ppVar17 + ((ulong)bVar18 * -2 + 1) * 8);
            iVar13._M_current = iVar13._M_current + (ulong)bVar18 * -0x10 + 8;
          }
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish + 1;
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_finish = iVar13._M_current;
        }
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     &local_a8);
          goto LAB_00135002;
        }
        ppVar17 = &local_a8;
      }
      else {
        if (paVar12->decay_Npart != 2) goto LAB_00135002;
        local_198.monval = paVar12->decay_part[0];
        iVar4 = paVar12->decay_part[1];
        local_120.monval = iVar4;
        local_a8.monval = local_198.monval;
        pmVar11 = std::
                  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  ::at(&this->resonance_table_,&local_a8.monval);
        local_198.mass = pmVar11->mass;
        local_a8.monval = iVar4;
        pmVar11 = std::
                  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  ::at(&this->resonance_table_,&local_a8.monval);
        local_120.mass = pmVar11->mass;
        perform_two_body_decay(this,mother,&local_198,&local_120);
        iVar13._M_current =
             (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     &local_198);
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppVar17 = &local_198;
          for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
            uVar7 = *(undefined4 *)&ppVar17->field_0x4;
            (iVar13._M_current)->monval = ppVar17->monval;
            *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar7;
            ppVar17 = (particle_info *)((long)ppVar17 + ((ulong)bVar18 * -2 + 1) * 8);
            iVar13._M_current = iVar13._M_current + (ulong)bVar18 * -0x10 + 8;
          }
          iVar13._M_current =
               (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish + 1;
          (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
          .super__Vector_impl_data._M_finish = iVar13._M_current;
        }
        if (iVar13._M_current ==
            (daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<particle_info,std::allocator<particle_info>>::
          _M_realloc_insert<particle_info_const&>
                    ((vector<particle_info,std::allocator<particle_info>> *)daughter_list,iVar13,
                     &local_120);
          goto LAB_00135002;
        }
        ppVar17 = &local_120;
      }
      for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
        uVar7 = *(undefined4 *)&ppVar17->field_0x4;
        (iVar13._M_current)->monval = ppVar17->monval;
        *(undefined4 *)&(iVar13._M_current)->field_0x4 = uVar7;
        ppVar17 = (particle_info *)((long)ppVar17 + ((ulong)bVar18 * -2 + 1) * 8);
        iVar13._M_current = iVar13._M_current + (ulong)bVar18 * -0x10 + 8;
      }
      ppaVar2 = &(daughter_list->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
      goto LAB_00135002;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning: pdg ",0xd);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cout,mother->monval);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10," not found, might be some table inconsistency",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
LAB_00135002:
  if (local_1b8.super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  return;
}

Assistant:

void particle_decay::perform_decays(
    particle_info &mother, std::vector<particle_info> &daughter_list) {
    particle_decay_info mother_decay_info;
    if (resonance_table_.find(mother.monval) == resonance_table_.end()) {
        std::cout << "Warning: pdg " << mother.monval
                  << " not found, might be some table inconsistency"
                  << std::endl;
        return;
    } else {
        mother_decay_info = resonance_table_[mother.monval];
    }
    if (mother_decay_info.stable == 1) {
        // the particle is a stable particle
        daughter_list.push_back(mother);
        return;
    }
    // std::cout << "Decaying " << mother_decay_info->name
    //           << "(" << mother_decay_info->monval << ") ..." << std::endl;
    int N_decay_channel = mother_decay_info.decays;
    double random_local = ran_gen_ptr_->rand_uniform();
    double cumulated_branching_ratio = 0.0;
    decay_channel_info *picked_channel = NULL;
    for (int i_channel = 0; i_channel < N_decay_channel; i_channel++) {
        cumulated_branching_ratio +=
            mother_decay_info.decay_channels[i_channel].branching_ratio;
        if (cumulated_branching_ratio > random_local) {
            picked_channel = &mother_decay_info.decay_channels[i_channel];
            break;
        }
    }
    int N_decay_part = picked_channel->decay_Npart;
    if (N_decay_part == 2) {
        particle_info daughter1;
        particle_info daughter2;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        perform_two_body_decay(mother, daughter1, daughter2);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
    } else if (N_decay_part == 3) {
        particle_info daughter1;
        particle_info daughter2;
        particle_info daughter3;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        int decay_part3_monval = picked_channel->decay_part[2];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter3.monval = decay_part3_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        daughter3.mass = get_particle_mass(decay_part3_monval);
        perform_three_body_decay(mother, daughter1, daughter2, daughter3);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
        daughter_list.push_back(daughter3);
    }
}